

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::home(void)

{
  char *pcVar1;
  runtime_error *this;
  Path *in_RDI;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  Pathie local_38 [32];
  char *local_18;
  char *homedir;
  
  pcVar1 = getenv("HOME");
  local_18 = pcVar1;
  if (pcVar1 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar1,&local_59);
    filename_to_utf8(local_38,(string *)local_58);
    Path(in_RDI,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"$HOME not defined.",&local_91);
  std::runtime_error::runtime_error(this,local_90);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Path Path::home()
{
#if defined(_PATHIE_UNIX)
  char* homedir = getenv("HOME");
  if (homedir)
    return Path(filename_to_utf8(homedir));
  else
    throw(std::runtime_error("$HOME not defined."));
#elif defined(_WIN32)
  /* TODO: Switch to KNOWNFOLDERID system as explained
   * on http://msdn.microsoft.com/en-us/library/windows/desktop/bb762494%28v=vs.85%29.aspx
   * and http://msdn.microsoft.com/en-us/library/windows/desktop/bb762181%28v=vs.85%29.aspx
   *. Howevever, MinGW does currently (September 2014) not have
   * the new KNOWNFOLDERID declarations.
   */

  wchar_t homedir[MAX_PATH];
  if (SHGetFolderPathW(NULL, CSIDL_PROFILE, NULL, SHGFP_TYPE_CURRENT, homedir) != S_OK)
    throw(std::runtime_error("Home directory not defined."));

  return Path(utf16_to_utf8(homedir));
#else
#error Unsupported system.
#endif
}